

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::Resize(RepeatedField<int> *this,int new_size,int *value)

{
  int *piVar1;
  int in_ESI;
  int *in_RDI;
  int *in_stack_ffffffffffffff80;
  RepeatedField<int> *in_stack_ffffffffffffffe0;
  
  if (*in_RDI < in_ESI) {
    Reserve(this,new_size);
    piVar1 = elements(in_stack_ffffffffffffffe0);
    piVar1 = piVar1 + *in_RDI;
    elements(in_stack_ffffffffffffffe0);
    std::fill<int*,int>(in_stack_ffffffffffffff80,piVar1,(int *)0x428ba2);
  }
  *in_RDI = in_ESI;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}